

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O2

IntegrationPointList<3> * anurbs::IntegrationPoints::xiao_gimbutas(size_t degree)

{
  invalid_argument *this;
  
  if (degree != 0) {
    if (degree <= (ulong)((_DAT_00395688 - s_xiao_gimbutas) / 0x18)) {
      return (IntegrationPointList<3> *)(degree * 0x18 + s_xiao_gimbutas + -0x18);
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid degree");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static IntegrationPointList<3>& xiao_gimbutas(const size_t degree)
    {
        if (degree < 1 || degree > s_xiao_gimbutas.size()) {
            throw std::invalid_argument("Invalid degree");
        }

        return s_xiao_gimbutas[degree - 1];
    }